

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

ENetPacket * enet_peer_receive(ENetPeer *peer,enet_uint8 *channelID)

{
  void *pvVar1;
  undefined1 *in_RSI;
  long in_RDI;
  ENetPacket *packet;
  ENetIncomingCommand *incomingCommand;
  ENetPacket *local_8;
  
  if (*(long *)(in_RDI + 0x130) == in_RDI + 0x130) {
    local_8 = (ENetPacket *)0x0;
  }
  else {
    pvVar1 = enet_list_remove(*(ENetListIterator *)(in_RDI + 0x130));
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = *(undefined1 *)((long)pvVar1 + 0x15);
    }
    local_8 = *(ENetPacket **)((long)pvVar1 + 0x58);
    local_8->referenceCount = local_8->referenceCount - 1;
    if (*(long *)((long)pvVar1 + 0x50) != 0) {
      enet_free((void *)0x10704b);
    }
    enet_free((void *)0x107055);
    *(size_t *)(in_RDI + 0x1d0) = *(long *)(in_RDI + 0x1d0) - local_8->dataLength;
  }
  return local_8;
}

Assistant:

ENetPacket *
enet_peer_receive (ENetPeer * peer, enet_uint8 * channelID)
{
   ENetIncomingCommand * incomingCommand;
   ENetPacket * packet;
   
   if (enet_list_empty (& peer -> dispatchedCommands))
     return NULL;

   incomingCommand = (ENetIncomingCommand *) enet_list_remove (enet_list_begin (& peer -> dispatchedCommands));

   if (channelID != NULL)
     * channelID = incomingCommand -> command.header.channelID;

   packet = incomingCommand -> packet;

   -- packet -> referenceCount;

   if (incomingCommand -> fragments != NULL)
     enet_free (incomingCommand -> fragments);

   enet_free (incomingCommand);

   peer -> totalWaitingData -= packet -> dataLength;

   return packet;
}